

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_no_thread.cpp
# Opt level: O0

MPP_RET mpp_dec_control_no_thread(MppDecImpl *dec,MpiCmd cmd,void *param)

{
  MPP_RET MVar1;
  Mutex *mutex;
  undefined1 local_30 [8];
  AutoMutex auto_lock;
  void *param_local;
  MpiCmd cmd_local;
  MppDecImpl *dec_local;
  
  auto_lock.mLock = (Mutex *)param;
  mutex = MppMutexCond::mutex(dec->cmd_lock);
  Mutex::Autolock::Autolock((Autolock *)local_30,mutex,1);
  dec->cmd_send = dec->cmd_send + 1;
  MVar1 = mpp_dec_proc_cfg(dec,cmd,auto_lock.mLock);
  Mutex::Autolock::~Autolock((Autolock *)local_30);
  return MVar1;
}

Assistant:

MPP_RET mpp_dec_control_no_thread(MppDecImpl *dec, MpiCmd cmd, void *param)
{
    // cmd_lock is used to sync all async operations
    AutoMutex auto_lock(dec->cmd_lock->mutex());

    dec->cmd_send++;
    return mpp_dec_proc_cfg(dec, cmd, param);
}